

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5HighlightFunction
               (Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
               sqlite3_value **apVal)

{
  char *zErr;
  int iCol;
  int rc;
  HighlightContext ctx;
  sqlite3_value **apVal_local;
  int nVal_local;
  sqlite3_context *pCtx_local;
  Fts5Context *pFts_local;
  Fts5ExtensionApi *pApi_local;
  
  ctx.zOut = (char *)apVal;
  if (nVal == 3) {
    zErr._0_4_ = sqlite3_value_int(*apVal);
    memset(&iCol,0,0x60);
    ctx._48_8_ = sqlite3_value_text(*(sqlite3_value **)(ctx.zOut + 8));
    ctx.zOpen = (char *)sqlite3_value_text(*(sqlite3_value **)(ctx.zOut + 0x10));
    zErr._4_4_ = (*pApi->xColumnText)(pFts,(int)zErr,&ctx.zClose,(int *)&ctx.zIn);
    if (ctx.zClose != (char *)0x0) {
      if (zErr._4_4_ == 0) {
        zErr._4_4_ = fts5CInstIterInit(pApi,pFts,(int)zErr,(CInstIter *)&iCol);
      }
      if (zErr._4_4_ == 0) {
        zErr._4_4_ = (*pApi->xTokenize)(pFts,ctx.zClose,(int)ctx.zIn,&iCol,fts5HighlightCb);
      }
      fts5HighlightAppend((int *)((long)&zErr + 4),(HighlightContext *)&iCol,
                          ctx.zClose + ctx.zIn._4_4_,(int)ctx.zIn - ctx.zIn._4_4_);
      if (zErr._4_4_ == 0) {
        sqlite3_result_text(pCtx,(char *)ctx._80_8_,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      }
      sqlite3_free((void *)ctx._80_8_);
    }
    if (zErr._4_4_ != 0) {
      sqlite3_result_error_code(pCtx,zErr._4_4_);
    }
  }
  else {
    sqlite3_result_error(pCtx,"wrong number of arguments to function highlight()",-1);
  }
  return;
}

Assistant:

static void fts5HighlightFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc;
  int iCol;

  if( nVal!=3 ){
    const char *zErr = "wrong number of arguments to function highlight()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  iCol = sqlite3_value_int(apVal[0]);
  memset(&ctx, 0, sizeof(HighlightContext));
  ctx.zOpen = (const char*)sqlite3_value_text(apVal[1]);
  ctx.zClose = (const char*)sqlite3_value_text(apVal[2]);
  rc = pApi->xColumnText(pFts, iCol, &ctx.zIn, &ctx.nIn);

  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iCol, &ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);

    if( rc==SQLITE_OK ){
      sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
    }
    sqlite3_free(ctx.zOut);
  }
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}